

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleMainExtended.cpp
# Opt level: O0

int main(int argvs,char **argv)

{
  bool bVar1;
  argvParser *paVar2;
  argParserAdvancedConfiguration *paVar3;
  ostream *this;
  allocator local_5c1;
  string local_5c0 [39];
  allocator local_599;
  string local_598 [39];
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [39];
  anon_class_1_0_00000001 local_4a9;
  function<void_()> local_4a8;
  allocator local_481;
  string local_480 [39];
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [39];
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [32];
  function<int_(int,_char_**)> local_230;
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  anon_class_1_0_00000001 local_191;
  undefined1 local_190 [8];
  function<int_(int,_char_**)> lambdaCallback;
  string local_168 [39];
  anon_class_1_0_00000001 local_141;
  function<void_()> local_140;
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [38];
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  argvParser *local_20;
  argvParser *p;
  char **argv_local;
  int argvs_local;
  
  argv_local._4_4_ = 0;
  p = (argvParser *)argv;
  argv_local._0_4_ = argvs;
  paVar2 = (argvParser *)operator_new(0x130);
  local_a2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"Extendend Example",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"This application intends to be an example ",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"",&local_a1);
  argvParser::argvParser(paVar2,(string *)local_40,(string *)local_78,true,(string *)local_a0);
  local_a2 = 0;
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = paVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"-t",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"--test",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"test argument",&local_119);
  std::function<void()>::function<main::__0,void>((function<void()> *)&local_140,&local_141);
  paVar3 = argvParser::addArg(paVar2,(string *)local_c8,(string *)local_f0,(string *)local_118,
                              &local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_168,
             "It is possible to add addition information for one command. Now the user can ype <-h -t> and see this additional information"
             ,(allocator *)((long)&lambdaCallback._M_invoker + 7));
  argParserAdvancedConfiguration::addAdditionalHelp(paVar3,(string *)local_168);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)((long)&lambdaCallback._M_invoker + 7));
  std::function<void_()>::~function(&local_140);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::function<int(int,char**)>::function<main::__1,void>
            ((function<int(int,char**)> *)local_190,&local_191);
  paVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"-f",&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"--foo",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"foo test argument  required argument example",&local_209);
  std::function<int_(int,_char_**)>::function(&local_230,(function<int_(int,_char_**)> *)local_190);
  paVar3 = argvParser::addArg(paVar2,(string *)local_1b8,(string *)local_1e0,(string *)local_208,
                              &local_230);
  paVar3 = argParserAdvancedConfiguration::required(paVar3);
  paVar3 = argParserAdvancedConfiguration::numberOfParameter(paVar3,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"prints the next element to the cli",&local_251);
  argParserAdvancedConfiguration::addAdditionalHelp(paVar3,(string *)local_250);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::function<int_(int,_char_**)>::~function(&local_230);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  paVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"-p",&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"--print",&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"echo text",&local_2c9);
  paVar3 = argvParser::addArg(paVar2,(string *)local_278,(string *)local_2a0,(string *)local_2c8,
                              printCallBack);
  paVar3 = argParserAdvancedConfiguration::numberOfParameter(paVar3,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"echo the next argument",&local_2f1);
  argParserAdvancedConfiguration::addAdditionalHelp(paVar3,(string *)local_2f0);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  paVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"-e",&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"--enums",&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"enum example",&local_369);
  paVar3 = argvParser::addArg(paVar2,(string *)local_318,(string *)local_340,(string *)local_368,
                              enumCallBack);
  paVar3 = argParserAdvancedConfiguration::numberOfParameter(paVar3,1);
  paVar3 = argParserAdvancedConfiguration::allowedParameter(paVar3,3,"abc","def","xyz");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_390,"here is just a pre defined set of arguments allowed",&local_391);
  argParserAdvancedConfiguration::addAdditionalHelp(paVar3,(string *)local_390);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  paVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"-o",&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"--open",&local_3e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"example to complete a file/dir",&local_409);
  paVar3 = argvParser::addArg(paVar2,(string *)local_3b8,(string *)local_3e0,(string *)local_408,
                              printCallBack);
  paVar3 = argParserAdvancedConfiguration::numberOfParameter(paVar3,1);
  argParserAdvancedConfiguration::asFile(paVar3);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  paVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"-nh",&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"--noHighlight",&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"disabledCli highlighting",&local_481);
  std::function<void()>::function<main::__2,void>((function<void()> *)&local_4a8,&local_4a9);
  argvParser::addArg(paVar2,(string *)local_430,(string *)local_458,(string *)local_480,&local_4a8);
  std::function<void_()>::~function(&local_4a8);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  paVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d0,"logging",&local_4d1);
  argvParser::addSection(paVar2,(string *)local_4d0);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  paVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"-l",&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"--logging",&local_521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"enable logging",&local_549);
  argvParser::addArg(paVar2,(string *)local_4f8,(string *)local_520,(string *)local_548,
                     loggingCallBack);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  paVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"-logf",&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_598,"--logFile",&local_599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c0,"generate logfile",&local_5c1);
  argvParser::addArg(paVar2,(string *)local_570,(string *)local_598,(string *)local_5c0,
                     logFileCallBack);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  bVar1 = argvParser::analyseArgv(local_20,(int)argv_local,(char **)p);
  if (!bVar1) {
    argvParser::printHelpMessage(local_20,(bool)(~disableCliH & 1));
    bVar1 = argvParser::foundAllRequierdArgs(local_20);
    if (!bVar1) {
      this = std::operator<<((ostream *)&std::cout,
                             "you have not entered at least one required argument  \n\t -f has been marked as an required argument try it with -f"
                            );
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
  }
  argv_local._4_4_ = 0;
  std::function<int_(int,_char_**)>::~function((function<int_(int,_char_**)> *)local_190);
  return argv_local._4_4_;
}

Assistant:

int main(int argvs, char **argv) {
    // define program description
    argvParser *p = new argvParser("Extendend Example","This application intends to be an example ");
    // define program arguments
    // Simple Lambda CallBack
    p->addArg("-t", "--test", "test argument", []() { cout << "got \"test\"" << endl; })
    ->addAdditionalHelp("It is possible to add addition information for one command. Now the user can ype <-h -t> and see this additional information"); // no further arguments used);
    // Lambda CallBack as required and one additional parameter
    function<int(int, char **)> lambdaCallback = [](int index, char **buff) {
        index++;
        cout << "got \"foo\" with : " << buff[index] << endl;
        return index;
    };
    p->addArg("-f", "--foo", "foo test argument  required argument example",
              lambdaCallback)->required()->numberOfParameter(1)->addAdditionalHelp("prints the next element to the cli");
    // Function as Callback
    p->addArg("-p", "--print", "echo text", printCallBack)->numberOfParameter(1)->addAdditionalHelp(
            "echo the next argument");
    // pre defined parameter for "-e"  with bash autocompletion
    p->addArg("-e", "--enums", "enum example", enumCallBack)->numberOfParameter(1)->allowedParameter(3, "abc", "def",
                                                                                                     "xyz")
            ->addAdditionalHelp("here is just a pre defined set of arguments allowed");
    // autocompletion with filenames
    p->addArg("-o", "--open", "example to complete a file/dir", printCallBack)->numberOfParameter(1)->asFile();
    // lambda
    p->addArg("-nh", "--noHighlight", "disabledCli highlighting", [] { disableCliH = false; });
    p->addSection("logging");
    p->addArg("-l", "--logging", "enable logging", loggingCallBack);
    p->addArg("-logf", "--logFile", "generate logfile", logFileCallBack);

    // check if all arguments are valid
    if (!p->analyseArgv(argvs, argv)) {
        p->printHelpMessage(!disableCliH);
        // check if all required arguments have been parsed
        if (!p->foundAllRequierdArgs()) {
            cout
                    << "you have not entered at least one required argument  \n\t -f has been marked as an required argument try it with -f"
                    << endl;
        }
    }

    return 0;
}